

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

InternalParseResult * __thiscall
Catch::clara::detail::Parser::parse
          (InternalParseResult *__return_storage_ptr__,Parser *this,string *exeName,
          TokenStream *tokens)

{
  ParserResult *__return_storage_ptr___00;
  ulong uVar1;
  long *plVar2;
  bool bVar3;
  ParseResultType PVar4;
  size_type sVar5;
  size_type sVar6;
  reference pOVar7;
  reference pAVar8;
  ParseState *pPVar9;
  long lVar10;
  ulong uVar11;
  Token *pTVar12;
  ParserInfo *local_2290;
  TokenStream local_2268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2240;
  undefined4 local_221c;
  TokenStream local_2218;
  BasicResult<Catch::clara::detail::ParseState> local_21f0;
  size_t *local_2190;
  ParserInfo *parseInfo;
  size_t i_1;
  undefined1 local_2178 [7];
  bool tokenParsed;
  ParseState local_2140;
  undefined1 local_2110 [8];
  BasicResult<Catch::clara::detail::ParseState> result;
  Arg *arg;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_> *__range3_1;
  Opt *opt;
  const_iterator __end3;
  const_iterator __begin3;
  vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_> *__range3;
  size_t i;
  ParserInfo parseInfos [512];
  size_t totalParsers;
  TokenStream *tokens_local;
  string *exeName_local;
  Parser *this_local;
  
  sVar5 = std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::size
                    (&this->m_options);
  sVar6 = std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::size
                    (&this->m_args);
  if ((ParserInfo *)0x1ff < (ParserInfo *)(sVar5 + sVar6)) {
    __assert_fail("totalParsers < 512",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cjuub[P]geemuboi/build_O0/_deps/args-src/catch.hpp"
                  ,0x2580,
                  "virtual InternalParseResult Catch::clara::detail::Parser::parse(const std::string &, const TokenStream &) const"
                 );
  }
  local_2290 = (ParserInfo *)&i;
  do {
    parse::ParserInfo::ParserInfo(local_2290);
    local_2290 = local_2290 + 1;
  } while (local_2290 != (ParserInfo *)&parseInfos[0x1ff].count);
  __range3 = (vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_> *)0x0;
  __end3 = std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::begin
                     (&this->m_options);
  opt = (Opt *)std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>::
               end(&this->m_options);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end3,(__normal_iterator<const_Catch::clara::detail::Opt_*,_std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>_>
                                     *)&opt), bVar3) {
    pOVar7 = __gnu_cxx::
             __normal_iterator<const_Catch::clara::detail::Opt_*,_std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>_>
             ::operator*(&__end3);
    parseInfos
    [(long)((long)&__range3[-1].
                   super__Vector_base<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7)].count = (size_t)pOVar7;
    __gnu_cxx::
    __normal_iterator<const_Catch::clara::detail::Opt_*,_std::vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>_>
    ::operator++(&__end3);
    __range3 = (vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_> *)
               ((long)&(__range3->
                       super__Vector_base<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>
                       )._M_impl.super__Vector_impl_data._M_start + 1);
  }
  __end3_1 = std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::
             begin(&this->m_args);
  arg = (Arg *)std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>::
               end(&this->m_args);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end3_1,
                            (__normal_iterator<const_Catch::clara::detail::Arg_*,_std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>_>
                             *)&arg), bVar3) {
    pAVar8 = __gnu_cxx::
             __normal_iterator<const_Catch::clara::detail::Arg_*,_std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>_>
             ::operator*(&__end3_1);
    parseInfos
    [(long)((long)&__range3[-1].
                   super__Vector_base<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7)].count = (size_t)pAVar8;
    __gnu_cxx::
    __normal_iterator<const_Catch::clara::detail::Arg_*,_std::vector<Catch::clara::detail::Arg,_std::allocator<Catch::clara::detail::Arg>_>_>
    ::operator++(&__end3_1);
    __range3 = (vector<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_> *)
               ((long)&(__range3->
                       super__Vector_base<Catch::clara::detail::Opt,_std::allocator<Catch::clara::detail::Opt>_>
                       )._M_impl.super__Vector_impl_data._M_start + 1);
  }
  __return_storage_ptr___00 = (ParserResult *)((long)&result.m_errorMessage.field_2 + 8);
  ExeName::set(__return_storage_ptr___00,&this->m_exeName,exeName);
  BasicResult<Catch::clara::detail::ParseResultType>::~BasicResult(__return_storage_ptr___00);
  ParseState::ParseState(&local_2140,NoMatch,tokens);
  BasicResult<Catch::clara::detail::ParseState>::ok<Catch::clara::detail::ParseState>
            ((BasicResult<Catch::clara::detail::ParseState> *)local_2110,&local_2140);
  ParseState::~ParseState(&local_2140);
  do {
    pPVar9 = ResultValueBase<Catch::clara::detail::ParseState>::value
                       ((ResultValueBase<Catch::clara::detail::ParseState> *)local_2110);
    ParseState::remainingTokens((TokenStream *)local_2178,pPVar9);
    bVar3 = TokenStream::operator_cast_to_bool((TokenStream *)local_2178);
    TokenStream::~TokenStream((TokenStream *)local_2178);
    if (!bVar3) {
      BasicResult<Catch::clara::detail::ParseState>::BasicResult
                (__return_storage_ptr__,(BasicResult<Catch::clara::detail::ParseState> *)local_2110)
      ;
      goto LAB_001e6d10;
    }
    i_1._7_1_ = 0;
    for (parseInfo = (ParserInfo *)0x0; parseInfo < (ParserInfo *)(sVar5 + sVar6);
        parseInfo = (ParserInfo *)((long)&parseInfo->parser + 1)) {
      local_2190 = &parseInfos[(long)((long)&parseInfo[-1].count + 7)].count;
      lVar10 = (**(code **)(*(long *)*local_2190 + 0x20))();
      if ((lVar10 == 0) ||
         (uVar1 = local_2190[1], uVar11 = (**(code **)(*(long *)*local_2190 + 0x20))(),
         uVar1 < uVar11)) {
        plVar2 = (long *)*local_2190;
        pPVar9 = ResultValueBase<Catch::clara::detail::ParseState>::value
                           ((ResultValueBase<Catch::clara::detail::ParseState> *)local_2110);
        ParseState::remainingTokens(&local_2218,pPVar9);
        (**(code **)(*plVar2 + 0x18))(&local_21f0,plVar2,exeName,&local_2218);
        BasicResult<Catch::clara::detail::ParseState>::operator=
                  ((BasicResult<Catch::clara::detail::ParseState> *)local_2110,&local_21f0);
        BasicResult<Catch::clara::detail::ParseState>::~BasicResult(&local_21f0);
        TokenStream::~TokenStream(&local_2218);
        bVar3 = BasicResult::operator_cast_to_bool((BasicResult *)local_2110);
        if (!bVar3) {
          BasicResult<Catch::clara::detail::ParseState>::BasicResult
                    (__return_storage_ptr__,
                     (BasicResult<Catch::clara::detail::ParseState> *)local_2110);
          goto LAB_001e6d10;
        }
        pPVar9 = ResultValueBase<Catch::clara::detail::ParseState>::value
                           ((ResultValueBase<Catch::clara::detail::ParseState> *)local_2110);
        PVar4 = ParseState::type(pPVar9);
        if (PVar4 != NoMatch) {
          i_1._7_1_ = 1;
          local_2190[1] = local_2190[1] + 1;
          break;
        }
      }
    }
    pPVar9 = ResultValueBase<Catch::clara::detail::ParseState>::value
                       ((ResultValueBase<Catch::clara::detail::ParseState> *)local_2110);
    PVar4 = ParseState::type(pPVar9);
    if (PVar4 == ShortCircuitAll) {
      BasicResult<Catch::clara::detail::ParseState>::BasicResult
                (__return_storage_ptr__,(BasicResult<Catch::clara::detail::ParseState> *)local_2110)
      ;
      goto LAB_001e6d10;
    }
    if ((i_1._7_1_ & 1) == 0) {
      pPVar9 = ResultValueBase<Catch::clara::detail::ParseState>::value
                         ((ResultValueBase<Catch::clara::detail::ParseState> *)local_2110);
      ParseState::remainingTokens(&local_2268,pPVar9);
      pTVar12 = TokenStream::operator->(&local_2268);
      std::operator+(&local_2240,"Unrecognised token: ",&pTVar12->token);
      BasicResult<Catch::clara::detail::ParseState>::runtimeError
                (__return_storage_ptr__,&local_2240);
      std::__cxx11::string::~string((string *)&local_2240);
      TokenStream::~TokenStream(&local_2268);
LAB_001e6d10:
      local_221c = 1;
      BasicResult<Catch::clara::detail::ParseState>::~BasicResult
                ((BasicResult<Catch::clara::detail::ParseState> *)local_2110);
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

auto parse( std::string const& exeName, TokenStream const &tokens ) const -> InternalParseResult override {

            struct ParserInfo {
                ParserBase const* parser = nullptr;
                size_t count = 0;
            };
            const size_t totalParsers = m_options.size() + m_args.size();
            assert( totalParsers < 512 );
            // ParserInfo parseInfos[totalParsers]; // <-- this is what we really want to do
            ParserInfo parseInfos[512];

            {
                size_t i = 0;
                for (auto const &opt : m_options) parseInfos[i++].parser = &opt;
                for (auto const &arg : m_args) parseInfos[i++].parser = &arg;
            }

            m_exeName.set( exeName );

            auto result = InternalParseResult::ok( ParseState( ParseResultType::NoMatch, tokens ) );
            while( result.value().remainingTokens() ) {
                bool tokenParsed = false;

                for( size_t i = 0; i < totalParsers; ++i ) {
                    auto&  parseInfo = parseInfos[i];
                    if( parseInfo.parser->cardinality() == 0 || parseInfo.count < parseInfo.parser->cardinality() ) {
                        result = parseInfo.parser->parse(exeName, result.value().remainingTokens());
                        if (!result)
                            return result;
                        if (result.value().type() != ParseResultType::NoMatch) {
                            tokenParsed = true;
                            ++parseInfo.count;
                            break;
                        }
                    }
                }

                if( result.value().type() == ParseResultType::ShortCircuitAll )
                    return result;
                if( !tokenParsed )
                    return InternalParseResult::runtimeError( "Unrecognised token: " + result.value().remainingTokens()->token );
            }
            // !TBD Check missing required options
            return result;
        }